

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O3

yajl_gen_status yajl_gen_array_open(yajl_gen g)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  yajl_gen_status yVar7;
  char *pcVar8;
  
  uVar4 = (ulong)g->depth;
  switch(g->state[uVar4]) {
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    yVar7 = yajl_gen_keys_must_be_strings;
    break;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) != 0) {
      pcVar8 = " ";
LAB_00105e7a:
      (*g->print)(g->ctx,pcVar8,1);
    }
    goto LAB_00105e84;
  default:
    goto switchD_00105dfc_caseD_4;
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) != 0) {
      pcVar8 = "\n";
      goto LAB_00105e7a;
    }
LAB_00105e84:
    uVar4 = (ulong)g->depth;
switchD_00105dfc_caseD_4:
    uVar3 = (uint)uVar4;
    if (((g->flags & 1) == 0) || (g->state[uVar4] == yajl_gen_map_val)) {
LAB_00105ecd:
      uVar3 = uVar3 + 1;
      g->depth = uVar3;
      if (0x7f < uVar3) {
        return yajl_max_depth_exceeded;
      }
    }
    else {
      if (uVar3 != 0) {
        uVar6 = 0;
        do {
          p_Var1 = g->print;
          pvVar2 = g->ctx;
          pcVar8 = g->indentString;
          sVar5 = strlen(pcVar8);
          (*p_Var1)(pvVar2,pcVar8,sVar5 & 0xffffffff);
          uVar6 = uVar6 + 1;
          uVar3 = g->depth;
        } while (uVar6 < uVar3);
        goto LAB_00105ecd;
      }
      g->depth = 1;
      uVar3 = 1;
    }
    g->state[uVar3] = yajl_gen_array_start;
    (*g->print)(g->ctx,"[",1);
    yVar7 = yajl_gen_status_ok;
    if ((((g->flags & 1) != 0) && ((*g->print)(g->ctx,"\n",1), (g->flags & 1) != 0)) &&
       (yVar7 = yajl_gen_status_ok, g->state[g->depth] == yajl_gen_complete)) {
      (*g->print)(g->ctx,"\n",1);
    }
    break;
  case yajl_gen_complete:
    yVar7 = yajl_gen_generation_complete;
    break;
  case yajl_gen_error:
    yVar7 = yajl_gen_in_error_state;
  }
  return yVar7;
}

Assistant:

yajl_gen_status
yajl_gen_array_open(yajl_gen g)
{
    ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    INCREMENT_DEPTH;
    g->state[g->depth] = yajl_gen_array_start;
    g->print(g->ctx, "[", 1);
    if ((g->flags & yajl_gen_beautify)) g->print(g->ctx, "\n", 1);
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}